

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_CURSE_ARMOR(effect_handler_context_t_conflict *context)

{
  int16_t iVar1;
  uint32_t uVar2;
  object *obj_00;
  wchar_t power;
  wchar_t pick;
  wchar_t max_tries;
  wchar_t num;
  char o_name [80];
  object *obj;
  effect_handler_context_t_conflict *context_local;
  
  obj_00 = equipped_item_by_slot_name(player,"body");
  if (obj_00 != (object *)0x0) {
    object_desc((char *)&max_tries,0x50,obj_00,3,player);
    if ((obj_00->artifact == (artifact *)0x0) || (uVar2 = Rand_div(100), 0x31 < (int)uVar2)) {
      uVar2 = Rand_div(3);
      pick = uVar2 + L'\x01';
      power = L'\x14';
      msg("A terrible black aura blasts your %s!",&max_tries);
      uVar2 = Rand_div(3);
      obj_00->to_a = obj_00->to_a - ((short)uVar2 + 1);
      while (pick != L'\0' && power != L'\0') {
        uVar2 = Rand_div(z_info->curse_max - 1);
        iVar1 = m_bonus(9,(int)player->depth);
        if ((curses[uVar2 + L'\x01'].poss[obj_00->tval] & 1U) == 0) {
          power = power + L'\xffffffff';
        }
        else {
          append_object_curse(obj_00,uVar2 + L'\x01',iVar1 * 10);
          pick = pick + L'\xffffffff';
        }
      }
      player->upkeep->update = player->upkeep->update | 1;
      player->upkeep->update = player->upkeep->update | 8;
      player->upkeep->redraw = player->upkeep->redraw | 0x60000;
    }
    else {
      msg("A %s tries to %s, but your %s resists the effects!","terrible black aura",
          "surround your armor",&max_tries);
    }
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_CURSE_ARMOR(effect_handler_context_t *context)
{
	struct object *obj;

	char o_name[80];

	/* Curse the body armor */
	obj = equipped_item_by_slot_name(player, "body");

	/* Nothing to curse */
	if (!obj) return (true);

	/* Describe */
	object_desc(o_name, sizeof(o_name), obj, ODESC_FULL, player);

	/* Attempt a saving throw for artifacts */
	if (obj->artifact && (randint0(100) < 50)) {
		msg("A %s tries to %s, but your %s resists the effects!",
				   "terrible black aura", "surround your armor", o_name);
	} else {
		int num = randint1(3);
		int max_tries = 20;
		msg("A terrible black aura blasts your %s!", o_name);

		/* Take down bonus a wee bit */
		obj->to_a -= randint1(3);

		/* Try to find enough appropriate curses */
		while (num && max_tries) {
			int pick = randint1(z_info->curse_max - 1);
			int power = 10 * m_bonus(9, player->depth);
			if (!curses[pick].poss[obj->tval]) {
				max_tries--;
				continue;
			}
			append_object_curse(obj, pick, power);
			num--;
		}

		/* Recalculate bonuses */
		player->upkeep->update |= (PU_BONUS);

		/* Recalculate mana */
		player->upkeep->update |= (PU_MANA);

		/* Window stuff */
		player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
	}

	context->ident = true;

	return (true);
}